

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void learn(svm_params *params,single_learner *param_2,example *ec)

{
  flat_example *params_00;
  float *pfVar1;
  ostream *poVar2;
  void *pvVar3;
  long in_RDX;
  long in_RDI;
  size_t in_stack_00000008;
  float *in_stack_00000010;
  svm_example **in_stack_00000018;
  float score;
  svm_example *sec;
  flat_example *fec;
  svm_params *in_stack_00000110;
  example *in_stack_ffffffffffffffb8;
  vw *in_stack_ffffffffffffffc0;
  float local_34;
  float local_30;
  float local_2c;
  svm_example *local_28;
  
  params_00 = flatten_sort_example(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (params_00 != (flat_example *)0x0) {
    local_28 = calloc_or_throw<svm_example>();
    svm_example::init_svm_example
              ((svm_example *)in_stack_ffffffffffffffc0,(flat_example *)in_stack_ffffffffffffffb8);
    local_2c = 0.0;
    predict((svm_params *)sec,in_stack_00000018,in_stack_00000010,in_stack_00000008);
    *(float *)(in_RDX + 0x6850) = local_2c;
    local_30 = 0.0;
    local_34 = -local_2c * *(float *)(in_RDX + 0x6828) + 1.0;
    pfVar1 = std::max<float>(&local_30,&local_34);
    *(float *)(in_RDX + 0x68b0) = *pfVar1;
    *(float *)(in_RDI + 0x80) = *(float *)(in_RDX + 0x68b0) + *(float *)(in_RDI + 0x80);
    if (((*(byte *)(*(long *)(in_RDI + 0x88) + 0x343a) & 1) != 0) &&
       (*(ulong *)(in_RDX + 0x6898) % 100 == 0)) {
      trim_cache((svm_params *)params_00);
    }
    if ((((*(byte *)(*(long *)(in_RDI + 0x88) + 0x343a) & 1) != 0) &&
        (*(ulong *)(in_RDX + 0x6898) % 1000 == 0)) && (1 < *(ulong *)(in_RDX + 0x6898))) {
      poVar2 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),
                               "Number of support vectors = ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,**(ulong **)(in_RDI + 0x38));
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),
                               "Number of kernel evaluations = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,num_kernel_evals);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,"Number of cache queries = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,num_cache_evals);
      poVar2 = std::operator<<(poVar2," loss sum = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x80));
      poVar2 = std::operator<<(poVar2," ");
      pfVar1 = v_array<float>::operator[]
                         ((v_array<float> *)(*(long *)(in_RDI + 0x38) + 0x28),
                          **(long **)(in_RDI + 0x38) - 1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pfVar1);
      poVar2 = std::operator<<(poVar2," ");
      pfVar1 = v_array<float>::operator[]
                         ((v_array<float> *)(*(long *)(in_RDI + 0x38) + 0x28),
                          **(long **)(in_RDI + 0x38) - 2);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,*pfVar1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    *(svm_example **)(*(long *)(in_RDI + 0x48) + *(long *)(in_RDI + 0x20) * 8) = local_28;
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
    if (*(long *)(in_RDI + 0x20) == *(long *)(in_RDI + 0x18)) {
      train(in_stack_00000110);
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
  }
  return;
}

Assistant:

void learn(svm_params& params, single_learner&, example& ec)
{
  flat_example* fec = flatten_sort_example(*(params.all), &ec);
  if (fec)
  {
    svm_example* sec = &calloc_or_throw<svm_example>();
    sec->init_svm_example(fec);
    float score = 0;
    predict(params, &sec, &score, 1);
    ec.pred.scalar = score;
    // cout<<"Score = "<<score<<endl;
    ec.loss = max(0.f, 1.f - score * ec.l.simple.label);
    params.loss_sum += ec.loss;
    if (params.all->training && ec.example_counter % 100 == 0)
      trim_cache(params);
    if (params.all->training && ec.example_counter % 1000 == 0 && ec.example_counter >= 2)
    {
      params.all->trace_message << "Number of support vectors = " << params.model->num_support << endl;
      params.all->trace_message << "Number of kernel evaluations = " << num_kernel_evals << " "
                                << "Number of cache queries = " << num_cache_evals << " loss sum = " << params.loss_sum
                                << " " << params.model->alpha[params.model->num_support - 1] << " "
                                << params.model->alpha[params.model->num_support - 2] << endl;
    }
    params.pool[params.pool_pos] = sec;
    params.pool_pos++;

    if (params.pool_pos == params.pool_size)
    {
      train(params);
      params.pool_pos = 0;
    }
  }
}